

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMDocumentImpl::removeChild(DOMDocumentImpl *this,DOMNode *oldChild)

{
  int iVar1;
  DOMNode *oldChild_local;
  DOMDocumentImpl *this_local;
  
  DOMParentNode::removeChild(&this->fParent,oldChild);
  iVar1 = (*oldChild->_vptr_DOMNode[4])();
  if (iVar1 == 1) {
    this->fDocElement = (DOMElement *)0x0;
  }
  else {
    iVar1 = (*oldChild->_vptr_DOMNode[4])();
    if (iVar1 == 10) {
      this->fDocType = (DOMDocumentType *)0x0;
    }
  }
  return oldChild;
}

Assistant:

DOMNode *DOMDocumentImpl::removeChild(DOMNode *oldChild)
{
    fParent.removeChild(oldChild);

    // If remove succeeded, un-cache the kid appropriately
    if(oldChild->getNodeType() == DOMNode::ELEMENT_NODE)
        fDocElement=0;
    else if(oldChild->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE)
        fDocType=0;

    return oldChild;
}